

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::SetEmailLogging(LogSeverity min_severity,char *addresses)

{
  int iVar1;
  MutexLock local_20;
  MutexLock l;
  
  if (3 < (uint)min_severity) {
    __assert_fail("min_severity >= 0 && min_severity < NUM_SEVERITIES",
                  "/workspace/llm4binary/github/license_c_cmakelists/koeppl[P]separate_chaining/external/glog/src/logging.cc"
                  ,0x2d8,
                  "static void google::LogDestination::SetEmailLogging(LogSeverity, const char *)");
  }
  local_20.mu_ = (Mutex *)log_mutex;
  if (log_mutex[0x38] == '\x01') {
    iVar1 = pthread_rwlock_wrlock((pthread_rwlock_t *)log_mutex);
    if (iVar1 != 0) {
      abort();
    }
  }
  LogDestination::email_logging_severity_ = min_severity;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &LogDestination::addresses__abi_cxx11_,addresses);
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_20);
  return;
}

Assistant:

void SetEmailLogging(LogSeverity min_severity, const char* addresses) {
  LogDestination::SetEmailLogging(min_severity, addresses);
}